

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

size_t duckdb_je_malloc_usable_size(void *ptr)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  tsd_t *tsd;
  ulong uVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  long lVar8;
  rtree_ctx_t *ctx;
  rtree_ctx_t local_190;
  
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)__tls_get_addr(&PTR_0249eae0);
    if ((tsd->state).repr != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
    if (ptr == (void *)0x0) {
      return 0;
    }
    if (tsd != (tsd_t *)0x0) {
      ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      goto LAB_00ce16ee;
    }
  }
  else if (ptr == (void *)0x0) {
    return 0;
  }
  ctx = &local_190;
  duckdb_je_rtree_ctx_data_init(ctx);
  tsd = (tsd_t *)0x0;
LAB_00ce16ee:
  uVar5 = (ulong)ptr & 0xffffffffc0000000;
  uVar7 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar7);
  uVar7 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar7);
  if (uVar7 == uVar5) {
    prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)ptr >> 9 & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar5) {
    prVar6 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar7;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
LAB_00ce1762:
    *puVar1 = uVar5;
    puVar1[1] = (ulong)prVar6;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar6->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    lVar8 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar8 + -8) == uVar5) {
        prVar6 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + lVar8);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar8 + -0x18);
        uVar4 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar8 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar4;
        *(ulong *)((long)ctx->cache + lVar8 + -0x18) = uVar7;
        *(ulong *)((long)(ctx->cache + -1) + lVar8) = puVar1[1];
        goto LAB_00ce1762;
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x188);
    prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                       ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,
                        false);
  }
  return duckdb_je_sz_index2size_tab[(ulong)(prVar6->le_bits).repr >> 0x30];
}

Assistant:

JEMALLOC_NOTHROW
je_malloc_usable_size(JEMALLOC_USABLE_SIZE_CONST void *ptr) {
	LOG("core.malloc_usable_size.entry", "ptr: %p", ptr);

	size_t ret = je_malloc_usable_size_impl(ptr);

	LOG("core.malloc_usable_size.exit", "result: %zu", ret);
	return ret;
}